

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

Surface * __thiscall SDL2pp::Surface::FillRects(Surface *this,Rect *rects,int count,Uint32 color)

{
  SDL_Surface *pSVar1;
  int iVar2;
  SDL_Rect *pSVar3;
  Exception *this_00;
  Rect *local_50;
  Rect *r;
  undefined1 local_38 [8];
  vector<SDL_Rect,_std::allocator<SDL_Rect>_> sdl_rects;
  Uint32 color_local;
  int count_local;
  Rect *rects_local;
  Surface *this_local;
  
  sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = color;
  sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = count;
  std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::vector
            ((vector<SDL_Rect,_std::allocator<SDL_Rect>_> *)local_38);
  std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::reserve
            ((vector<SDL_Rect,_std::allocator<SDL_Rect>_> *)local_38,
             (long)sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_50 = rects;
      local_50 !=
      rects + sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    std::vector<SDL_Rect,std::allocator<SDL_Rect>>::emplace_back<SDL2pp::Rect_const&>
              ((vector<SDL_Rect,std::allocator<SDL_Rect>> *)local_38,local_50);
  }
  pSVar1 = this->surface_;
  pSVar3 = std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::data
                     ((vector<SDL_Rect,_std::allocator<SDL_Rect>_> *)local_38);
  iVar2 = SDL_FillRects(pSVar1,pSVar3,
                        sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                        (Uint32)sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x50);
    Exception::Exception(this_00,"SDL_FillRects");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::~vector
            ((vector<SDL_Rect,_std::allocator<SDL_Rect>_> *)local_38);
  return this;
}

Assistant:

Surface& Surface::FillRects(const Rect* rects, int count, Uint32 color) {
	std::vector<SDL_Rect> sdl_rects;
	sdl_rects.reserve(static_cast<size_t>(count));
	for (const Rect* r = rects; r != rects + count; ++r)
		sdl_rects.emplace_back(*r);

	if (SDL_FillRects(surface_, sdl_rects.data(), count, color) != 0)
		throw Exception("SDL_FillRects");
	return *this;
}